

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O3

void __thiscall test_b_tree::setup(test_b_tree *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  pointer __first;
  pointer __last;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  default_random_engine rng;
  b_tree t;
  string local_80;
  b_tree local_60;
  
  paVar1 = &local_60._p._fileName.field_2;
  local_60._p._fileName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"test.db","");
  b_tree::create_db_file((string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._p._fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._p._fileName._M_dataplus._M_p,
                    local_60._p._fileName.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"test.db","");
  b_tree::b_tree(&local_60,&local_80,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  __last = test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  __first = test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start;
  auVar2 = _DAT_0010a150;
  if (test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar4 = (long)test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (-8 - (long)test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
    auVar12._8_4_ = (int)uVar4;
    auVar12._0_8_ = uVar4;
    auVar12._12_4_ = (int)(uVar4 >> 0x20);
    auVar7._0_8_ = uVar4 >> 3;
    auVar7._8_8_ = auVar12._8_8_ >> 3;
    uVar5 = 0;
    auVar7 = auVar7 ^ _DAT_0010a150;
    auVar10 = _DAT_0010a140;
    do {
      auVar12 = auVar10 ^ auVar2;
      if ((bool)(~(auVar12._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar12._0_4_ ||
                  auVar7._4_4_ < auVar12._4_4_) & 1)) {
        __first[uVar5] = uVar5;
      }
      if ((auVar12._12_4_ != auVar7._12_4_ || auVar12._8_4_ <= auVar7._8_4_) &&
          auVar12._12_4_ <= auVar7._12_4_) {
        __first[uVar5 + 1] = uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar6 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar6 + 2;
    } while (((uVar4 >> 3) + 2 & 0x3ffffffffffffffe) != uVar5);
  }
  puVar3 = test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar10 = _DAT_0010a150;
  auVar2 = _DAT_0010a140;
  if (test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar6 = (long)__last - (long)__first >> 3;
    uVar5 = (long)test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish +
            (-8 - (long)test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    auVar8._8_4_ = (int)uVar5;
    auVar8._0_8_ = uVar5;
    auVar8._12_4_ = (int)(uVar5 >> 0x20);
    auVar9._0_8_ = uVar5 >> 3;
    auVar9._8_8_ = auVar8._8_8_ >> 3;
    uVar4 = 0;
    auVar9 = auVar9 ^ _DAT_0010a150;
    do {
      auVar11._8_4_ = (int)uVar4;
      auVar11._0_8_ = uVar4;
      auVar11._12_4_ = (int)(uVar4 >> 0x20);
      auVar12 = (auVar11 | auVar2) ^ auVar10;
      if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                  auVar9._4_4_ < auVar12._4_4_) & 1)) {
        puVar3[uVar4] = lVar6 + uVar4;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        puVar3[uVar4 + 1] = lVar6 + uVar4 + 1;
      }
      uVar4 = uVar4 + 2;
    } while (((uVar5 >> 3) + 2 & 0x3ffffffffffffffe) != uVar4);
  }
  local_80._M_dataplus._M_p = (pointer)0x1;
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__first,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__last,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_80);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_80);
  insert_all<b_tree>(&local_60,&test_keys);
  pager::~pager(&local_60._p);
  return;
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}